

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerimeterPointCoordinate.cpp
# Opt level: O2

KFLOAT32 * __thiscall
KDIS::DATA_TYPE::PerimeterPointCoordinate::operator[](PerimeterPointCoordinate *this,KUINT16 i)

{
  KException *this_00;
  int iVar1;
  undefined6 in_register_00000032;
  long lStack_50;
  allocator<char> local_39;
  KString local_38;
  
  iVar1 = (int)CONCAT62(in_register_00000032,i);
  if (iVar1 == 0) {
    lStack_50 = 8;
  }
  else {
    if (iVar1 != 1) {
      this_00 = (KException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"operator[]",&local_39)
      ;
      KException::KException(this_00,&local_38,7);
      __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
    }
    lStack_50 = 0xc;
  }
  return (KFLOAT32 *)((long)&(this->super_DataTypeBase)._vptr_DataTypeBase + lStack_50);
}

Assistant:

KFLOAT32 &PerimeterPointCoordinate::operator[](KUINT16 i) noexcept(false)
{
    switch( i )
    {
    case 0:
        return m_f32X;
    case 1:
        return m_f32Y;
    default:
        throw KException( __FUNCTION__, OUT_OF_BOUNDS );
    }
}